

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMessageCommand.cxx
# Opt level: O2

bool __thiscall
cmMessageCommand::InitialPass
          (cmMessageCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  cmMakefile *pcVar1;
  bool bVar2;
  bool bVar3;
  cmMessenger *this_00;
  MessageType t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  allocator<char> local_89;
  string message;
  undefined1 local_68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_40;
  
  __lhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (__lhs == pbVar4) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&message,"called with incorrect number of arguments",
               (allocator<char> *)local_68);
    cmCommand::SetError(&this->super_cmCommand,&message);
  }
  else {
    bVar2 = std::operator==(__lhs,"SEND_ERROR");
    local_48 = pbVar4;
    if (bVar2) {
      t = FATAL_ERROR;
LAB_001a6635:
      bVar3 = false;
      local_40.Begin._M_current = __lhs + 1;
LAB_001a6639:
      bVar2 = false;
    }
    else {
      bVar2 = std::operator==(__lhs,"FATAL_ERROR");
      if (!bVar2) {
        bVar2 = std::operator==(__lhs,"WARNING");
        if (bVar2) {
          t = WARNING;
          goto LAB_001a6635;
        }
        bVar2 = std::operator==(__lhs,"AUTHOR_WARNING");
        if (bVar2) {
          pcVar1 = (this->super_cmCommand).Makefile;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&message,"CMAKE_SUPPRESS_DEVELOPER_ERRORS",
                     (allocator<char> *)&local_40);
          bVar2 = cmMakefile::IsSet(pcVar1,&message);
          if (bVar2) {
            pcVar1 = (this->super_cmCommand).Makefile;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_68,"CMAKE_SUPPRESS_DEVELOPER_ERRORS",&local_89);
            bVar2 = cmMakefile::IsOn(pcVar1,(string *)local_68);
            bVar2 = !bVar2;
            std::__cxx11::string::~string((string *)local_68);
          }
          else {
            bVar2 = false;
          }
          std::__cxx11::string::~string((string *)&message);
          if (bVar2 == false) {
            pcVar1 = (this->super_cmCommand).Makefile;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&message,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS",
                       (allocator<char> *)local_68);
            bVar3 = cmMakefile::IsOn(pcVar1,&message);
            std::__cxx11::string::~string((string *)&message);
            t = AUTHOR_WARNING;
            if (bVar3) goto LAB_001a6775;
          }
          else {
            t = AUTHOR_ERROR;
          }
          goto LAB_001a668b;
        }
        bVar2 = std::operator==(__lhs,"STATUS");
        t = MESSAGE;
        if (bVar2) {
          bVar3 = true;
          local_40.Begin._M_current = __lhs + 1;
        }
        else {
          bVar2 = std::operator==(__lhs,"DEPRECATION");
          if (bVar2) {
            pcVar1 = (this->super_cmCommand).Makefile;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&message,"CMAKE_ERROR_DEPRECATED",(allocator<char> *)local_68);
            bVar2 = cmMakefile::IsOn(pcVar1,&message);
            std::__cxx11::string::~string((string *)&message);
            if (bVar2) {
              t = DEPRECATION_ERROR;
            }
            else {
              pcVar1 = (this->super_cmCommand).Makefile;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&message,"CMAKE_WARN_DEPRECATED",(allocator<char> *)&local_40);
              bVar3 = cmMakefile::IsSet(pcVar1,&message);
              if (bVar3) {
                pcVar1 = (this->super_cmCommand).Makefile;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)local_68,"CMAKE_WARN_DEPRECATED",&local_89);
                bVar3 = cmMakefile::IsOn(pcVar1,(string *)local_68);
                std::__cxx11::string::~string((string *)local_68);
                std::__cxx11::string::~string((string *)&message);
                if (!bVar3) goto LAB_001a6775;
              }
              else {
                std::__cxx11::string::~string((string *)&message);
              }
              t = DEPRECATION_WARNING;
            }
            goto LAB_001a668b;
          }
          bVar3 = false;
          local_40.Begin._M_current = __lhs;
        }
        goto LAB_001a6639;
      }
      bVar2 = true;
      t = FATAL_ERROR;
LAB_001a668b:
      local_40.Begin._M_current = __lhs + 1;
      bVar3 = false;
    }
    local_40.End._M_current =
         (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    local_68._0_8_ = local_68 + 0x10;
    local_68._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_68[0x10] = '\0';
    cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              (&message,&local_40,(char *)local_68._0_8_);
    std::__cxx11::string::~string((string *)local_68);
    if (t == MESSAGE) {
      if (bVar3) {
        cmMakefile::DisplayStatus((this->super_cmCommand).Makefile,&message,-1.0);
        pbVar4 = local_48;
      }
      else {
        cmSystemTools::Message(&message,(char *)0x0);
        pbVar4 = local_48;
      }
    }
    else {
      this_00 = cmMakefile::GetMessenger((this->super_cmCommand).Makefile);
      cmMakefile::GetBacktrace((cmMakefile *)local_68);
      cmMessenger::DisplayMessage(this_00,t,&message,(cmListFileBacktrace *)local_68);
      pbVar4 = local_48;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
    }
    if (bVar2 != false) {
      cmSystemTools::s_FatalErrorOccured = true;
    }
  }
  std::__cxx11::string::~string((string *)&message);
LAB_001a6775:
  return __lhs != pbVar4;
}

Assistant:

bool cmMessageCommand::InitialPass(std::vector<std::string> const& args,
                                   cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  std::vector<std::string>::const_iterator i = args.begin();

  MessageType type = MessageType::MESSAGE;
  bool status = false;
  bool fatal = false;
  if (*i == "SEND_ERROR") {
    type = MessageType::FATAL_ERROR;
    ++i;
  } else if (*i == "FATAL_ERROR") {
    fatal = true;
    type = MessageType::FATAL_ERROR;
    ++i;
  } else if (*i == "WARNING") {
    type = MessageType::WARNING;
    ++i;
  } else if (*i == "AUTHOR_WARNING") {
    if (this->Makefile->IsSet("CMAKE_SUPPRESS_DEVELOPER_ERRORS") &&
        !this->Makefile->IsOn("CMAKE_SUPPRESS_DEVELOPER_ERRORS")) {
      fatal = true;
      type = MessageType::AUTHOR_ERROR;
    } else if (!this->Makefile->IsOn("CMAKE_SUPPRESS_DEVELOPER_WARNINGS")) {
      type = MessageType::AUTHOR_WARNING;
    } else {
      return true;
    }
    ++i;
  } else if (*i == "STATUS") {
    status = true;
    ++i;
  } else if (*i == "DEPRECATION") {
    if (this->Makefile->IsOn("CMAKE_ERROR_DEPRECATED")) {
      fatal = true;
      type = MessageType::DEPRECATION_ERROR;
    } else if ((!this->Makefile->IsSet("CMAKE_WARN_DEPRECATED") ||
                this->Makefile->IsOn("CMAKE_WARN_DEPRECATED"))) {
      type = MessageType::DEPRECATION_WARNING;
    } else {
      return true;
    }
    ++i;
  }

  std::string message = cmJoin(cmMakeRange(i, args.end()), std::string());

  if (type != MessageType::MESSAGE) {
    // we've overridden the message type, above, so display it directly
    cmMessenger* m = this->Makefile->GetMessenger();
    m->DisplayMessage(type, message, this->Makefile->GetBacktrace());
  } else {
    if (status) {
      this->Makefile->DisplayStatus(message, -1);
    } else {
      cmSystemTools::Message(message);
    }
  }
  if (fatal) {
    cmSystemTools::SetFatalErrorOccured();
  }
  return true;
}